

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Unspill<wabt::(anonymous_namespace)::CWriter::Unspill(std::vector<wabt::Type,std::allocator<wabt::Type>>const&)::__0>
          (CWriter *this,TypeVector *types,anon_class_8_1_a8b54799 *tgt)

{
  Type type;
  char cVar1;
  size_type sVar2;
  ulong uVar3;
  const_reference pvVar4;
  StackVar SVar5;
  StackVar local_68;
  StackVar local_54;
  uint local_48;
  Newline local_41;
  Index i;
  Enum EStack_3c;
  Index local_38;
  StackVar local_2c;
  __0 *local_20;
  anon_class_8_1_a8b54799 *tgt_local;
  TypeVector *types_local;
  CWriter *this_local;
  
  local_20 = (__0 *)tgt;
  tgt_local = (anon_class_8_1_a8b54799 *)types;
  types_local = (TypeVector *)this;
  sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
  if (sVar2 != 0) {
    sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)tgt_local);
    if (sVar2 == 1) {
      SVar5 = Unspill(std::vector<wabt::Type,std::allocator<wabt::Type>>const&)::$_0::operator()
                        (local_20,0);
      _i = SVar5._0_8_;
      local_2c.index = i;
      local_2c.type.enum_ = EStack_3c;
      local_38 = SVar5.type.type_index_;
      local_2c.type.type_index_ = local_38;
      _i = SVar5;
      Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[8],wabt::(anonymous_namespace)::Newline>
                (this,&local_2c,(char (*) [8])" = tmp;",&local_41);
    }
    else {
      local_48 = 0;
      while( true ) {
        uVar3 = (ulong)local_48;
        sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                          ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)tgt_local);
        if (sVar2 <= uVar3) break;
        SVar5 = Unspill(std::vector<wabt::Type,std::allocator<wabt::Type>>const&)::$_0::operator()
                          (local_20,local_48);
        local_68._0_8_ = SVar5._0_8_;
        local_54.index = local_68.index;
        local_54.type.enum_ = local_68.type.enum_;
        local_68.type.type_index_ = SVar5.type.type_index_;
        local_54.type.type_index_ = local_68.type.type_index_;
        anon_unknown_0::CWriter::Write((CWriter *)this,&local_54);
        pvVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::at
                           ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)tgt_local,
                            (ulong)local_48);
        type.enum_ = pvVar4->enum_;
        type.type_index_ = pvVar4->type_index_;
        cVar1 = anon_unknown_0::CWriter::MangleType(type);
        anon_unknown_0::CWriter::Writef
                  ((CWriter *)this," = tmp.%c%d;",(ulong)(uint)(int)cVar1,(ulong)local_48);
        anon_unknown_0::CWriter::Write((CWriter *)this);
        local_48 = local_48 + 1;
      }
    }
    return;
  }
  __assert_fail("types.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                ,0xbb5,
                "void wabt::(anonymous namespace)::CWriter::Unspill(const TypeVector &, const targets &) [targets = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:3012:18)]"
               );
}

Assistant:

void CWriter::Unspill(const TypeVector& types, const targets& tgt) {
  assert(types.size() > 0);

  if (types.size() == 1) {
    Write(tgt(0), " = tmp;", Newline());
    return;
  }

  for (Index i = 0; i < types.size(); ++i) {
    Write(tgt(i));
    Writef(" = tmp.%c%d;", MangleType(types.at(i)), i);
    Write(Newline());
  }
}